

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void accumulate_pack_bs_data
               (AV1_COMP *cpi,PackBSParams *pack_bs_params_arr,uint8_t *dst,uint32_t *total_size,
               FrameHeaderInfo *fh_info,int *largest_tile_id,uint *max_tile_size,
               uint32_t *obu_header_size,uint8_t **tile_data_start,int num_workers)

{
  uint uVar1;
  uint8_t **tile_data_start_00;
  int iVar2;
  uint *in_RCX;
  long in_RDX;
  long in_RSI;
  AV1_COMP *in_RDI;
  int *in_R9;
  uint *in_stack_00000008;
  undefined4 *in_stack_00000010;
  long *in_stack_00000018;
  int in_stack_00000020;
  ThreadData_conflict *td;
  int idx;
  MultiThreadInfo *mt_info;
  uint32_t tile_size;
  PackBSParams *pack_bs_params;
  int tile_idx;
  size_t dst_offset;
  size_t src_offset;
  uint8_t *curr_tg_start;
  int is_first_tg;
  size_t curr_tg_data_size;
  int tile_count;
  CommonTileParams *tiles;
  AV1_COMMON *cm;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff4c;
  aom_write_bit_buffer *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  AV1_COMP *in_stack_ffffffffffffff60;
  MultiThreadInfo *pMVar3;
  undefined4 in_stack_ffffffffffffff78;
  int iVar4;
  int *is_first_tg_00;
  uint8_t *puVar5;
  uint32_t local_64;
  uint8_t *local_60;
  int local_54;
  CommonTileParams *local_50;
  AV1_COMMON *local_48;
  int *local_40;
  uint *local_30;
  long local_28;
  long local_20;
  AV1_COMP *local_18;
  
  local_48 = &in_RDI->common;
  local_50 = &(in_RDI->common).tiles;
  local_54 = local_50->cols * (in_RDI->common).tiles.rows;
  local_60 = (uint8_t *)0x0;
  local_64 = 1;
  puVar5 = (uint8_t *)0x0;
  is_first_tg_00 = (int *)0x0;
  local_40 = in_R9;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  for (iVar4 = 0; iVar4 < local_54; iVar4 = iVar4 + 1) {
    tile_data_start_00 = (uint8_t **)(local_20 + (long)iVar4 * 0x58);
    if (*(int *)((long)tile_data_start_00 + 0x54) != 0) {
      in_RDX = local_28 + (ulong)*local_30;
      local_60 = (uint8_t *)(long)*(int *)(tile_data_start_00 + 8);
      *in_stack_00000018 = *in_stack_00000018 + (long)*(int *)(tile_data_start_00 + 8);
      *in_stack_00000010 = *(undefined4 *)((long)tile_data_start_00 + 0x3c);
    }
    iVar2 = 4;
    if (*(int *)(tile_data_start_00 + 10) != 0) {
      iVar2 = 0;
    }
    local_60 = tile_data_start_00[2] + iVar2 + (long)local_60;
    if ((uint8_t *)(ulong)*in_stack_00000008 < tile_data_start_00[2]) {
      *local_40 = iVar4;
      *in_stack_00000008 = (uint)tile_data_start_00[2];
    }
    uVar1 = (int)tile_data_start_00[2] + *(int *)tile_data_start_00[3];
    if (iVar4 != 0) {
      memmove((void *)(local_28 + (long)is_first_tg_00),puVar5 + local_28,(ulong)uVar1);
    }
    if (*(int *)(tile_data_start_00 + 10) != 0) {
      av1_write_last_tile_info
                (in_stack_ffffffffffffff60,
                 (FrameHeaderInfo *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 in_stack_ffffffffffffff50,
                 (size_t *)
                 CONCAT44(in_stack_ffffffffffffff4c,(uint)*(byte *)(tile_data_start_00 + 7)),
                 (uint8_t *)CONCAT44(in_stack_ffffffffffffff44,*in_stack_00000010),&local_64,
                 tile_data_start_00,(int *)CONCAT44(iVar4,in_stack_ffffffffffffff78),is_first_tg_00,
                 (uint32_t)puVar5,(uint8_t)in_RDX);
    }
    puVar5 = tile_data_start_00[6] + (long)puVar5;
    is_first_tg_00 = (int *)((ulong)uVar1 + (long)is_first_tg_00);
    *local_30 = uVar1 + *local_30;
  }
  pMVar3 = &local_18->mt_info;
  iVar4 = in_stack_00000020;
  while (iVar4 = iVar4 + -1, -1 < iVar4) {
    av1_accumulate_pack_bs_thread_data(local_18,pMVar3->tile_thr_data[iVar4].td);
  }
  return;
}

Assistant:

static void accumulate_pack_bs_data(
    AV1_COMP *const cpi, const PackBSParams *const pack_bs_params_arr,
    uint8_t *const dst, uint32_t *total_size, const FrameHeaderInfo *fh_info,
    int *const largest_tile_id, unsigned int *max_tile_size,
    uint32_t *const obu_header_size, uint8_t **tile_data_start,
    const int num_workers) {
  const AV1_COMMON *const cm = &cpi->common;
  const CommonTileParams *const tiles = &cm->tiles;
  const int tile_count = tiles->cols * tiles->rows;
  // Fixed size tile groups for the moment
  size_t curr_tg_data_size = 0;
  int is_first_tg = 1;
  uint8_t *curr_tg_start = dst;
  size_t src_offset = 0;
  size_t dst_offset = 0;

  for (int tile_idx = 0; tile_idx < tile_count; tile_idx++) {
    // PackBSParams stores all parameters required to pack tile and header
    // info.
    const PackBSParams *const pack_bs_params = &pack_bs_params_arr[tile_idx];
    uint32_t tile_size = 0;

    if (pack_bs_params->new_tg) {
      curr_tg_start = dst + *total_size;
      curr_tg_data_size = pack_bs_params->curr_tg_hdr_size;
      *tile_data_start += pack_bs_params->curr_tg_hdr_size;
      *obu_header_size = pack_bs_params->obu_header_size;
    }
    curr_tg_data_size +=
        pack_bs_params->buf.size + (pack_bs_params->is_last_tile_in_tg ? 0 : 4);

    if (pack_bs_params->buf.size > *max_tile_size) {
      *largest_tile_id = tile_idx;
      *max_tile_size = (unsigned int)pack_bs_params->buf.size;
    }
    tile_size +=
        (uint32_t)pack_bs_params->buf.size + *pack_bs_params->total_size;

    // Pack all the chunks of tile bitstreams together
    if (tile_idx != 0) memmove(dst + dst_offset, dst + src_offset, tile_size);

    if (pack_bs_params->is_last_tile_in_tg)
      av1_write_last_tile_info(
          cpi, fh_info, pack_bs_params->saved_wb, &curr_tg_data_size,
          curr_tg_start, &tile_size, tile_data_start, largest_tile_id,
          &is_first_tg, *obu_header_size, pack_bs_params->obu_extn_header);
    src_offset += pack_bs_params->tile_buf_size;
    dst_offset += tile_size;
    *total_size += tile_size;
  }

  // Accumulate thread data
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  for (int idx = num_workers - 1; idx >= 0; idx--) {
    ThreadData const *td = mt_info->tile_thr_data[idx].td;
    av1_accumulate_pack_bs_thread_data(cpi, td);
  }
}